

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O2

void __thiscall
CombinedH264Demuxer::getTrackList
          (CombinedH264Demuxer *this,
          map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
          *trackList)

{
  mapped_type *pmVar1;
  undefined1 auStack_38 [48];
  
  TrackInfo::TrackInfo((TrackInfo *)auStack_38,0xe,"",0);
  pmVar1 = std::
           map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>::
           operator[](trackList,&MVC_STREAM_INDEX);
  TrackInfo::operator=(pmVar1,(TrackInfo *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  TrackInfo::TrackInfo((TrackInfo *)auStack_38,1,"",0);
  pmVar1 = std::
           map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>::
           operator[](trackList,&AVC_STREAM_INDEX);
  TrackInfo::operator=(pmVar1,(TrackInfo *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  return;
}

Assistant:

void CombinedH264Demuxer::getTrackList(std::map<int32_t, TrackInfo>& trackList)
{
    trackList[MVC_STREAM_INDEX] = TrackInfo(CODEC_V_MPEG4_H264_DEP, "", 0);
    trackList[AVC_STREAM_INDEX] = TrackInfo(CODEC_V_MPEG4_H264, "", 0);
}